

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O2

void __thiscall MidiPlayerDialog::on_addButton_clicked(MidiPlayerDialog *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  undefined4 uVar4;
  int iVar5;
  Master *this_00;
  QSettings *pQVar6;
  iterator iVar7;
  QStringList fileNames;
  QArrayDataPointer<char16_t> local_70;
  anon_union_24_3_e3d07ef4_for_data local_58;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined8 local_20;
  
  this_00 = Master::getInstance();
  pQVar6 = Master::getSettings(this_00);
  if (on_addButton_clicked()::currentDir == '\0') {
    iVar5 = __cxa_guard_acquire(&on_addButton_clicked()::currentDir);
    if (iVar5 != 0) {
      QString::QString((QString *)&local_70,"Master/LastAddMidiFileDir");
      local_38.shared = (PrivateShared *)0x0;
      local_38._8_8_ = 0;
      local_38._16_8_ = 0;
      local_20 = 2;
      QSettings::value((QString *)&local_58,(QVariant *)pQVar6);
      QVariant::toString();
      QVariant::~QVariant((QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      __cxa_atexit(QString::~QString,&on_addButton_clicked::currentDir,&__dso_handle);
      __cxa_guard_release(&on_addButton_clicked()::currentDir);
    }
  }
  QString::QString((QString *)&local_70,"Master/qFileDialogOptions");
  QVariant::QVariant((QVariant *)&local_38,0);
  QSettings::value((QString *)&local_58,(QVariant *)pQVar6);
  uVar4 = QVariant::toInt((bool *)local_58.data);
  QVariant::~QVariant((QVariant *)&local_58);
  QVariant::~QVariant((QVariant *)&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QString::QString((QString *)&local_58,(char *)0x0);
  QString::QString((QString *)&local_70,"*.mid *.smf *.syx;;*.mid;;*.smf;;*.syx;;*.*");
  QFileDialog::getOpenFileNames
            (&local_38,this,&local_58,&on_addButton_clicked::currentDir,&local_70,0,uVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  if (local_38._16_8_ != 0) {
    iVar7 = QList<QString>::begin((QList<QString> *)&local_38);
    QDir::QDir((QDir *)&local_70,iVar7.i);
    QDir::absolutePath();
    qVar3 = on_addButton_clicked::currentDir.d.size;
    pcVar2 = on_addButton_clicked::currentDir.d.ptr;
    pDVar1 = on_addButton_clicked::currentDir.d.d;
    on_addButton_clicked::currentDir.d.d = (Data *)local_58.shared;
    on_addButton_clicked::currentDir.d.ptr = (char16_t *)local_58._8_8_;
    local_58.shared = (PrivateShared *)pDVar1;
    local_58._8_8_ = pcVar2;
    on_addButton_clicked::currentDir.d.size = local_58._16_8_;
    local_58._16_8_ = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QDir::~QDir((QDir *)&local_70);
    QString::QString((QString *)&local_70,"Master/LastAddMidiFileDir");
    QVariant::QVariant((QVariant *)&local_58,&on_addButton_clicked::currentDir);
    QSettings::setValue((QString *)pQVar6,(QVariant *)&local_70);
    QVariant::~QVariant((QVariant *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    iVar5 = QListWidget::currentRow();
    QListWidget::insertItems((int)*(undefined8 *)(this->ui + 0x18),(QList *)(ulong)(iVar5 + 1));
    QListWidget::setCurrentRow((int)*(undefined8 *)(this->ui + 0x18));
    updateCurrentItem(this);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_38);
  return;
}

Assistant:

void MidiPlayerDialog::on_addButton_clicked() {
	QSettings *settings = Master::getInstance()->getSettings();
	static QString currentDir = settings->value("Master/LastAddMidiFileDir").toString();
	QFileDialog::Options qFileDialogOptions = QFileDialog::Options(settings->value("Master/qFileDialogOptions", 0).toInt());
	QStringList fileNames = QFileDialog::getOpenFileNames(this, NULL, currentDir, "*.mid *.smf *.syx;;*.mid;;*.smf;;*.syx;;*.*",
		NULL, qFileDialogOptions);
	if (fileNames.isEmpty()) return;
	currentDir = QDir(fileNames.first()).absolutePath();
	settings->setValue("Master/LastAddMidiFileDir", currentDir);
	int row = ui->playList->currentRow();
	ui->playList->insertItems(row + 1, fileNames);
	ui->playList->setCurrentRow(row + fileNames.count());
	updateCurrentItem();
}